

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void dummy_Op_SetNativeFloatElementI(void)

{
  return;
}

Assistant:

BOOL JavascriptOperators::OP_SetNativeFloatElementI_UInt32(
        Var instance,
        uint32 aElementIndex,
        ScriptContext* scriptContext,
        PropertyOperationFlags flags,
        double dValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_SetNativeFloatElementI_UInt32);
        JIT_HELPER_SAME_ATTRIBUTES(Op_SetNativeFloatElementI_UInt32, Op_SetNativeFloatElementI);
#if FLOATVAR
        return OP_SetNativeFloatElementI(instance, JavascriptNumber::ToVar(aElementIndex, scriptContext), scriptContext, flags, dValue);
#else
        char buffer[sizeof(Js::JavascriptNumber)];
        return OP_SetNativeFloatElementI(instance, JavascriptNumber::ToVarInPlace(aElementIndex, scriptContext,
            (Js::JavascriptNumber *)buffer), scriptContext, flags, dValue);
#endif
        JIT_HELPER_END(Op_SetNativeFloatElementI_UInt32);
    }